

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O1

bool __thiscall CFG::toCYK(CFG *this,string *strToEvaluate,string *htmlString)

{
  pointer pcVar1;
  string *psVar2;
  pointer pbVar3;
  bool bVar4;
  long *plVar5;
  pointer pvVar6;
  int row;
  long lVar7;
  pointer pbVar8;
  CFG *pCVar9;
  ulong uVar10;
  string *psVar11;
  ulong uVar12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string subString;
  string subStr1;
  int column;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> production;
  string subStr2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  productionsToSubStr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  productionsSubstr2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  productionsSubstr1;
  undefined1 local_258 [40];
  ulong local_230;
  undefined1 local_228 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  undefined8 local_1f8;
  string *local_1e8;
  string *local_1e0;
  CFG *local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  value_type local_1b8;
  string local_198;
  undefined1 local_178 [72];
  _Alloc_hider local_130 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  string local_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_c0;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_1e8 = htmlString;
  local_1d8 = this;
  std::__cxx11::string::_M_replace
            ((ulong)htmlString,0,(char *)htmlString->_M_string_length,0x143046);
  local_208._M_allocated_capacity = 0;
  local_208._8_8_ = 0;
  local_1f8 = 0;
  uVar12 = strToEvaluate->_M_string_length;
  if (uVar12 != 0) {
    uVar10 = 0;
    do {
      local_258._0_8_ = (pointer)0x0;
      local_258._8_8_ = (pointer)0x0;
      local_258._16_8_ = (pointer)0x0;
      if (strToEvaluate->_M_string_length != 0) {
        uVar12 = 0;
        do {
          local_228._0_8_ = (pointer)0x0;
          local_228._8_8_ = (pointer)0x0;
          local_228._16_8_ = (pointer)0x0;
          std::
          vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          ::emplace_back<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      *)local_258,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_228);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_228);
          uVar12 = uVar12 + 1;
        } while (uVar12 < strToEvaluate->_M_string_length);
      }
      std::
      vector<std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
      ::push_back((vector<std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                   *)&local_208,(value_type *)local_258);
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)local_258);
      uVar10 = uVar10 + 1;
      uVar12 = strToEvaluate->_M_string_length;
    } while (uVar10 < uVar12);
  }
  local_178._0_8_ = (pointer)0x0;
  local_178._8_8_ = (pointer)0x0;
  local_178._16_8_ = (pointer)0x0;
  local_1e0 = strToEvaluate;
  if (uVar12 != 0) {
    pcVar1 = (strToEvaluate->_M_dataplus)._M_p;
    uVar10 = 0;
    do {
      toString_abi_cxx11_((string *)local_258,pcVar1[uVar10]);
      __l._M_len = 1;
      __l._M_array = (iterator)local_258;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_48,__l,(allocator_type *)local_130);
      findVariables((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_228,local_1d8,&local_48);
      std::
      vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
      ::emplace_back<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  *)local_178,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_228);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_228);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      if ((pointer)local_258._0_8_ != (pointer)(local_258 + 0x10)) {
        operator_delete((void *)local_258._0_8_,(ulong)(local_258._16_8_ + 1));
      }
      uVar10 = uVar10 + 1;
    } while (uVar12 != uVar10);
  }
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::operator=((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)local_208._M_allocated_capacity,
              (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)local_178);
  pCVar9 = (CFG *)local_178;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&local_c0,
           (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)pCVar9);
  psVar11 = local_1e0;
  psVar2 = local_1e8;
  rowHtmlString((string *)local_228,pCVar9,&local_c0);
  plVar5 = (long *)std::__cxx11::string::_M_append(local_228,(ulong)(psVar2->_M_dataplus)._M_p);
  pvVar6 = (pointer)(plVar5 + 2);
  if ((pointer)*plVar5 == pvVar6) {
    local_258._16_8_ =
         (pvVar6->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_258._24_8_ = plVar5[3];
    local_258._0_8_ = (pointer)(local_258 + 0x10);
  }
  else {
    local_258._16_8_ =
         (pvVar6->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_258._0_8_ = (pointer)*plVar5;
  }
  local_258._8_8_ = plVar5[1];
  *plVar5 = (long)pvVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::operator=((string *)psVar2,(string *)local_258);
  if ((pointer)local_258._0_8_ != (pointer)(local_258 + 0x10)) {
    operator_delete((void *)local_258._0_8_,(ulong)(local_258._16_8_ + 1));
  }
  if ((pointer)local_228._0_8_ != (pointer)(local_228 + 0x10)) {
    operator_delete((void *)local_228._0_8_,(ulong)(local_228._16_8_ + 1));
  }
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_c0);
  if (1 < (ulong)(((long)(local_208._8_8_ - local_208._0_8_) >> 3) * -0x5555555555555555)) {
    local_230 = 1;
    do {
      if (local_208._8_8_ - local_208._0_8_ != 0) {
        uVar10 = ((long)(local_208._8_8_ - local_208._0_8_) >> 3) * -0x5555555555555555;
        local_178._64_8_ = local_230 + 1;
        local_1c8 = local_230;
        uVar12 = 0;
        do {
          local_1c0 = local_230 + uVar12;
          if (uVar12 <= uVar10 - 1 && local_1c0 <= uVar10 - 1) {
            std::__cxx11::string::substr((ulong)local_258,(ulong)psVar11);
            local_178._32_8_ = (pointer)0x0;
            local_178._40_8_ = (pointer)0x0;
            local_178._48_8_ = (pointer)0x0;
            local_1d0 = uVar12;
            do {
              uVar10 = local_1d0;
              psVar2 = local_1e0;
              lVar7 = uVar12 - local_1d0;
              std::__cxx11::string::substr((ulong)local_228,(ulong)local_1e0);
              uVar12 = uVar12 + 1;
              std::__cxx11::string::substr((ulong)local_130,(ulong)psVar2);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_78,
                       (((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)(local_208._M_allocated_capacity + lVar7 * 0x18))->
                       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar10);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_90,
                       (((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)(local_208._M_allocated_capacity + (local_1c0 - uVar12) * 0x18))->
                       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar12);
              findAtoBCproductions(&local_f0,local_1d8,&local_78,&local_90);
              pbVar3 = local_f0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (pbVar8 = local_f0.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar3;
                  pbVar8 = pbVar8 + 1) {
                local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
                pcVar1 = (pbVar8->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1b8,pcVar1,pcVar1 + pbVar8->_M_string_length);
                local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_198,local_1b8._M_dataplus._M_p,
                           local_1b8._M_dataplus._M_p + local_1b8._M_string_length);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_60,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(local_178 + 0x20));
                bVar4 = inVector(&local_198,&local_60);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_60);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_198._M_dataplus._M_p != &local_198.field_2) {
                  operator_delete(local_198._M_dataplus._M_p,
                                  local_198.field_2._M_allocated_capacity + 1);
                }
                if (!bVar4) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(local_178 + 0x20),&local_1b8);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
                  operator_delete(local_1b8._M_dataplus._M_p,
                                  local_1b8.field_2._M_allocated_capacity + 1);
                }
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_f0);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_90);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_78);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130[0]._M_p != &local_120) {
                operator_delete(local_130[0]._M_p,local_120._M_allocated_capacity + 1);
              }
              if ((pointer)local_228._0_8_ != (pointer)(local_228 + 0x10)) {
                operator_delete((void *)local_228._0_8_,(ulong)(local_228._16_8_ + 1));
              }
            } while (uVar12 != local_1c8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=((((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)(local_208._M_allocated_capacity + local_230 * 0x18))->
                        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + uVar10,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(local_178 + 0x20));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_178 + 0x20));
            uVar12 = local_1d0;
            psVar11 = local_1e0;
            if ((pointer)local_258._0_8_ != (pointer)(local_258 + 0x10)) {
              operator_delete((void *)local_258._0_8_,(ulong)(local_258._16_8_ + 1));
              uVar12 = local_1d0;
              psVar11 = local_1e0;
            }
          }
          uVar12 = uVar12 + 1;
          uVar10 = ((long)(local_208._8_8_ - local_208._0_8_) >> 3) * -0x5555555555555555;
          local_1c8 = local_1c8 + 1;
        } while (uVar12 <= uVar10 && uVar10 - uVar12 != 0);
      }
      pCVar9 = (CFG *)(local_208._M_allocated_capacity + local_230 * 0x18);
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::vector(&local_a8,
               (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)pCVar9);
      rowHtmlString((string *)local_228,pCVar9,&local_a8);
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_228,(ulong)(local_1e8->_M_dataplus)._M_p);
      pvVar6 = (pointer)(plVar5 + 2);
      if ((pointer)*plVar5 == pvVar6) {
        local_258._16_8_ =
             (pvVar6->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        local_258._24_8_ = plVar5[3];
        local_258._0_8_ = (pointer)(local_258 + 0x10);
      }
      else {
        local_258._16_8_ =
             (pvVar6->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        local_258._0_8_ = (pointer)*plVar5;
      }
      local_258._8_8_ = plVar5[1];
      *plVar5 = (long)pvVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::operator=((string *)local_1e8,(string *)local_258);
      if ((pointer)local_258._0_8_ != (pointer)(local_258 + 0x10)) {
        operator_delete((void *)local_258._0_8_,(ulong)(local_258._16_8_ + 1));
      }
      if ((pointer)local_228._0_8_ != (pointer)(local_228 + 0x10)) {
        operator_delete((void *)local_228._0_8_,(ulong)(local_228._16_8_ + 1));
      }
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector(&local_a8);
      local_230 = local_230 + 1;
      uVar12 = ((long)(local_208._8_8_ - local_208._0_8_) >> 3) * -0x5555555555555555;
    } while (local_230 <= uVar12 && uVar12 - local_230 != 0);
  }
  psVar2 = local_1e8;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
                 "<table border=\"1\">",local_1e8);
  std::__cxx11::string::operator=((string *)psVar2,(string *)local_258);
  if ((pointer)local_258._0_8_ != (pointer)(local_258 + 0x10)) {
    operator_delete((void *)local_258._0_8_,(ulong)(local_258._16_8_ + 1));
  }
  pcVar1 = (local_1d8->startS)._M_dataplus._M_p;
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,pcVar1,pcVar1 + (local_1d8->startS)._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_d8,
           *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             **)(local_208._8_8_ + -0x18));
  bVar4 = inVector(&local_110,&local_d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)local_178);
  std::
  vector<std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
             *)&local_208);
  return bVar4;
}

Assistant:

bool CFG::toCYK(std::string strToEvaluate, std::string &htmlString) {

    htmlString = "</table>";

    // I assume we're working with a CNF
    std::vector<std::vector<std::vector<std::string>>> cykTable = {};
    for (int l = 0; l < strToEvaluate.size(); ++l) {
        std::vector<std::vector<std::string>> row = {};
        for (int i = 0; i < strToEvaluate.size(); ++i) {
            row.push_back({});
        }
        cykTable.push_back(row);
    }

    std::vector<std::vector<std::string>> firstRow = {};
    for (char c: strToEvaluate) {
        firstRow.emplace_back(findVariables({toString(c)}));
    }
    cykTable[0] = firstRow;

    htmlString = rowHtmlString(firstRow) + htmlString;

    for (int row = 1; row < cykTable.size(); ++row) { // Row we're going to fill
        for (int column = 0; column < cykTable.size(); ++column) { // Column we're going to fill
            int i = column;
            int j = i + row; // row = j-i+1 <=> j = row + i - 1;

            if (i >= j or j > cykTable.size() - 1 or i > cykTable.size() - 1) continue;

            std::string subString = strToEvaluate.substr(i, j - i + 1);
            std::vector<std::string> productionsToStr = {};
            for (int k = i; k < j; ++k) {
                std::string subStr1 = strToEvaluate.substr(i, k - i + 1);
                std::string subStr2 = strToEvaluate.substr(k + 1, j - k);
                std::vector<std::string> productionsSubstr1 = findProductionsInCYK(i, k, cykTable);
                std::vector<std::string> productionsSubstr2 = findProductionsInCYK(k + 1, j, cykTable);
                std::vector<std::string> productionsToSubStr = findAtoBCproductions(productionsSubstr1,
                                                                                    productionsSubstr2);
                for (auto production: productionsToSubStr) {
                    if (!inVector(production, productionsToStr)) {
                        productionsToStr.push_back(production);
                    }
                }
            }
            cykTable[row][column] = productionsToStr;
        }
        htmlString = rowHtmlString(cykTable[row]) + htmlString;
    }

    htmlString = "<table border=\"1\">" + htmlString;

    // Cyk table should now be finished, check whether the startstate is in the upper left corner
    return inVector(startS, cykTable[cykTable.size() - 1][0]);
}